

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int handle_max_data_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  _func_void_void_ptr_char_ptr_varargs *p_Var1;
  int iVar2;
  uint64_t uVar3;
  
  uVar3 = ptls_decode_quicint(&state->src,state->end);
  if (uVar3 == 0xffffffffffffffff) {
    iVar2 = 0x20007;
  }
  else {
    p_Var1 = (conn->super).tracer.cb;
    if (p_Var1 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
      (*p_Var1)((conn->super).tracer.ctx,
                "{\"type\":\"max-data-receive\", \"time\":%lld, \"maximum\":%llu}\n",
                (conn->stash).now,uVar3);
    }
    iVar2 = 0;
    if ((conn->egress).max_data.permitted < uVar3) {
      (conn->egress).max_data.permitted = uVar3;
      (conn->egress).data_blocked = QUICLY_SENDER_STATE_UNACKED;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int handle_max_data_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_max_data_frame_t frame;
    int ret;

    if ((ret = quicly_decode_max_data_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(MAX_DATA_RECEIVE, conn, conn->stash.now, frame.max_data);

    if (frame.max_data <= conn->egress.max_data.permitted)
        return 0;
    conn->egress.max_data.permitted = frame.max_data;
    conn->egress.data_blocked = QUICLY_SENDER_STATE_UNACKED; /* DATA_BLOCKED has not been sent for the new limit */

    return 0;
}